

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

void __thiscall lest::ptags::~ptags(ptags *this)

{
  __copy_move<false,false,std::bidirectional_iterator_tag> a_Stack_28 [16];
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_18;
  
  local_18._M_stream = (this->super_action).os;
  local_18._M_string = "\n";
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            (a_Stack_28,(this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(this->result)._M_t._M_impl.super__Rb_tree_header,&local_18);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->result)._M_t);
  return;
}

Assistant:

~ptags()
    {
        std::copy( result.begin(), result.end(), std::ostream_iterator<text>( os, "\n" ) );
    }